

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StrAppend(string *result,AlphaNum *a)

{
  LogMessage *other;
  char *pcVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  pcVar1 = a->piece_data_;
  if ((ulong)((long)pcVar1 - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62a);
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                      );
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcVar1 = a->piece_data_;
  }
  std::__cxx11::string::append((char *)result,(ulong)pcVar1);
  return;
}

Assistant:

void StrAppend(string *result, const AlphaNum &a) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  result->append(a.data(), a.size());
}